

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

uchar * extra_get_record(isoent *isoent,int *space,int *off,int *loc)

{
  isoent *piVar1;
  extr_rec **ppeVar2;
  anon_struct_24_3_5afa785c_for_extr_rec_list *paVar3;
  extr_rec *peVar4;
  anon_struct_24_3_5afa785c_for_extr_rec_list *paVar5;
  uint uVar6;
  uint uVar7;
  
  piVar1 = isoent->parent;
  if (off == (int *)0x0) {
    if (((piVar1->extr_rec_list).first == (extr_rec *)0x0) ||
       (ppeVar2 = (piVar1->extr_rec_list).last, 0x7e4 < *(int *)((long)ppeVar2 + -0x804))) {
      peVar4 = (extr_rec *)malloc(0x810);
      if (peVar4 == (extr_rec *)0x0) {
        return (uchar *)0x0;
      }
      peVar4->location = 0;
      peVar4->offset = 0;
      peVar4->next = (extr_rec *)0x0;
      paVar3 = (anon_struct_24_3_5afa785c_for_extr_rec_list *)(piVar1->extr_rec_list).last;
      paVar5 = &piVar1->extr_rec_list;
      if (paVar3 != (anon_struct_24_3_5afa785c_for_extr_rec_list *)0x0) {
        paVar5 = paVar3;
      }
      paVar5->first = peVar4;
      (piVar1->extr_rec_list).last = &peVar4->next;
    }
    else {
      peVar4 = (extr_rec *)(ppeVar2 + -0x101);
    }
  }
  else {
    peVar4 = (piVar1->extr_rec_list).current;
    if (0x7e4 < peVar4->offset) {
      peVar4 = peVar4->next;
    }
  }
  uVar6 = 0x7e4 - peVar4->offset;
  uVar7 = 0x7e3 - peVar4->offset;
  if ((uVar6 & 1) == 0) {
    uVar7 = uVar6;
  }
  *space = uVar7;
  if (off != (int *)0x0) {
    *off = peVar4->offset;
  }
  if (loc != (int *)0x0) {
    *loc = peVar4->location;
  }
  (piVar1->extr_rec_list).current = peVar4;
  return peVar4->buf + peVar4->offset;
}

Assistant:

static unsigned char *
extra_get_record(struct isoent *isoent, int *space, int *off, int *loc)
{
	struct extr_rec *rec;

	isoent = isoent->parent;
	if (off != NULL) {
		/* Storing data into an extra record. */
		rec = isoent->extr_rec_list.current;
		if (DR_SAFETY > LOGICAL_BLOCK_SIZE - rec->offset)
			rec = rec->next;
	} else {
		/* Calculating the size of an extra record. */
		rec = extra_last_record(isoent);
		if (rec == NULL ||
		    DR_SAFETY > LOGICAL_BLOCK_SIZE - rec->offset) {
			rec = malloc(sizeof(*rec));
			if (rec == NULL)
				return (NULL);
			rec->location = 0;
			rec->offset = 0;
			/* Insert `rec` into the tail of isoent->extr_rec_list */
			rec->next = NULL;
			/*
			 * Note: testing isoent->extr_rec_list.last == NULL
			 * here is really unneeded since it has been already
			 * initialized at isoent_new function but Clang Static
			 * Analyzer claims that it is dereference of null
			 * pointer.
			 */
			if (isoent->extr_rec_list.last == NULL)
				isoent->extr_rec_list.last =
					&(isoent->extr_rec_list.first);
			*isoent->extr_rec_list.last = rec;
			isoent->extr_rec_list.last = &(rec->next);
		}
	}
	*space = LOGICAL_BLOCK_SIZE - rec->offset - DR_SAFETY;
	if (*space & 0x01)
		*space -= 1;/* Keep padding space. */
	if (off != NULL)
		*off = rec->offset;
	if (loc != NULL)
		*loc = rec->location;
	isoent->extr_rec_list.current = rec;

	return (&rec->buf[rec->offset]);
}